

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O0

void __thiscall
asio::detail::reactive_socket_service_base::
start_op<asio::detail::reactive_socket_recv_op<asio::mutable_buffers_1,std::function<void(std::error_code_const&,unsigned_long)>,asio::any_io_executor>>
          (reactive_socket_service_base *this,base_implementation_type *impl,int op_type,
          reactive_socket_recv_op<asio::mutable_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
          *op,bool is_continuation,bool allow_speculative,bool noop,bool needs_non_blocking,
          void *param_9,
          enable_if_t<is_same<typename_associated_immediate_executor<typename_reactive_socket_recv_op<mutable_buffers_1,_function<void_(const_error_code_&,_unsigned_long)>,_any_io_executor>::handler_type,_typename_reactive_socket_recv_op<mutable_buffers_1,_function<void_(const_error_code_&,_unsigned_long)>,_any_io_executor>::io_executor_type>::asio_associated_immediate_executor_is_unspecialised,_void>::value>
          *param_10)

{
  base_implementation_type *in_RCX;
  undefined4 in_EDX;
  undefined1 in_R8B;
  undefined4 in_R9D;
  _func_void_operation_ptr_bool_void_ptr *unaff_retaddr;
  undefined1 in_stack_00000008;
  undefined7 in_stack_00000009;
  undefined1 in_stack_00000010;
  undefined4 in_stack_ffffffffffffffe0;
  
  do_start_op((reactive_socket_service_base *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX,
              CONCAT31(CONCAT21(CONCAT11(in_R8B,SUB41(in_R9D,0)),in_stack_00000008),
                       in_stack_00000010) & 0x1010101,(reactor_op *)in_RCX,
              SUB41((uint)in_R9D >> 0x18,0),SUB41((uint)in_R9D >> 0x10,0),SUB41((uint)in_R9D >> 8,0)
              ,SUB41(in_R9D,0),unaff_retaddr,(void *)CONCAT71(in_stack_00000009,in_stack_00000008));
  return;
}

Assistant:

void start_op(base_implementation_type& impl, int op_type,
      Op* op, bool is_continuation, bool allow_speculative,
      bool noop, bool needs_non_blocking, const void*,
      enable_if_t<
        is_same<
          typename associated_immediate_executor<
            typename Op::handler_type,
            typename Op::io_executor_type
          >::asio_associated_immediate_executor_is_unspecialised,
          void
        >::value
      >*)
  {
    return do_start_op(impl, op_type, op, is_continuation,
        allow_speculative, noop, needs_non_blocking,
        &reactor::call_post_immediate_completion, &reactor_);
  }